

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mo_lambda.cpp
# Opt level: O0

plural_ptr __thiscall
booster::locale::gnu_gettext::lambda::anon_unknown_0::parser::value_expr(parser *this)

{
  int iVar1;
  pointer ppVar2;
  undefined8 *in_RSI;
  __uniq_ptr_data<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>,_true,_true>
  in_RDI;
  parser *in_stack_00000038;
  int value;
  plural_ptr op;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  tokenizer *in_stack_ffffffffffffff80;
  
  std::
  unique_ptr<booster::locale::gnu_gettext::lambda::plural,std::default_delete<booster::locale::gnu_gettext::lambda::plural>>
  ::unique_ptr<std::default_delete<booster::locale::gnu_gettext::lambda::plural>,void>
            ((unique_ptr<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
              *)in_stack_ffffffffffffff80);
  iVar1 = tokenizer::next((tokenizer *)*in_RSI,(int *)0x0);
  if (iVar1 == 0x28) {
    tokenizer::get(in_stack_ffffffffffffff80,
                   (int *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    cond_expr(in_stack_00000038);
    std::
    unique_ptr<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
    ::operator=((unique_ptr<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
                 *)in_stack_ffffffffffffff80,
                (unique_ptr<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
                 *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    ppVar2 = std::
             unique_ptr<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
             ::get((unique_ptr<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
                    *)in_stack_ffffffffffffff80);
    std::
    unique_ptr<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
    ::~unique_ptr((unique_ptr<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
                   *)in_stack_ffffffffffffff80);
    if (ppVar2 == (pointer)0x0) {
      std::
      unique_ptr<booster::locale::gnu_gettext::lambda::plural,std::default_delete<booster::locale::gnu_gettext::lambda::plural>>
      ::unique_ptr<std::default_delete<booster::locale::gnu_gettext::lambda::plural>,void>
                ((unique_ptr<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
                  *)in_stack_ffffffffffffff80);
    }
    else {
      iVar1 = tokenizer::get(in_stack_ffffffffffffff80,
                             (int *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      if (iVar1 == 0x29) {
        std::
        unique_ptr<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
        ::unique_ptr((unique_ptr<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
                      *)in_stack_ffffffffffffff80,
                     (unique_ptr<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
                      *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      }
      else {
        std::
        unique_ptr<booster::locale::gnu_gettext::lambda::plural,std::default_delete<booster::locale::gnu_gettext::lambda::plural>>
        ::unique_ptr<std::default_delete<booster::locale::gnu_gettext::lambda::plural>,void>
                  ((unique_ptr<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
                    *)in_stack_ffffffffffffff80);
      }
    }
  }
  else {
    iVar1 = tokenizer::next((tokenizer *)*in_RSI,(int *)0x0);
    if (iVar1 == 0x108) {
      tokenizer::get(in_stack_ffffffffffffff80,
                     (int *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      operator_new(0x10);
      number::number((number *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
      std::
      unique_ptr<booster::locale::gnu_gettext::lambda::plural,std::default_delete<booster::locale::gnu_gettext::lambda::plural>>
      ::unique_ptr<std::default_delete<booster::locale::gnu_gettext::lambda::plural>,void>
                ((unique_ptr<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
                  *)in_stack_ffffffffffffff80,
                 (pointer)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    }
    else {
      iVar1 = tokenizer::next((tokenizer *)*in_RSI,(int *)0x0);
      if (iVar1 == 0x109) {
        tokenizer::get(in_stack_ffffffffffffff80,
                       (int *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
        in_stack_ffffffffffffff80 = (tokenizer *)operator_new(8);
        memset(in_stack_ffffffffffffff80,0,8);
        identity::identity((identity *)in_stack_ffffffffffffff80);
        std::
        unique_ptr<booster::locale::gnu_gettext::lambda::plural,std::default_delete<booster::locale::gnu_gettext::lambda::plural>>
        ::unique_ptr<std::default_delete<booster::locale::gnu_gettext::lambda::plural>,void>
                  ((unique_ptr<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
                    *)in_stack_ffffffffffffff80,
                   (pointer)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
      }
      else {
        std::
        unique_ptr<booster::locale::gnu_gettext::lambda::plural,std::default_delete<booster::locale::gnu_gettext::lambda::plural>>
        ::unique_ptr<std::default_delete<booster::locale::gnu_gettext::lambda::plural>,void>
                  ((unique_ptr<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
                    *)in_stack_ffffffffffffff80);
      }
    }
  }
  std::
  unique_ptr<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
  ::~unique_ptr((unique_ptr<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
                 *)in_stack_ffffffffffffff80);
  return (__uniq_ptr_data<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>,_true,_true>
          )(tuple<booster::locale::gnu_gettext::lambda::plural_*,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
            )in_RDI.
             super___uniq_ptr_impl<booster::locale::gnu_gettext::lambda::plural,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
             ._M_t.
             super__Tuple_impl<0UL,_booster::locale::gnu_gettext::lambda::plural_*,_std::default_delete<booster::locale::gnu_gettext::lambda::plural>_>
             .super__Head_base<0UL,_booster::locale::gnu_gettext::lambda::plural_*,_false>.
             _M_head_impl;
}

Assistant:

plural_ptr value_expr()
        {
            plural_ptr op;
            if(t.next()=='(') {
                t.get();
                if((op=cond_expr()).get()==0)
                    return plural_ptr();
                if(t.get()!=')')
                    return plural_ptr();
                return op;
            }
            else if(t.next()==NUM) {
                int value;
                t.get(&value);
                return plural_ptr(new number(value));
            }
            else if(t.next()==VARIABLE) {
                t.get();
                return plural_ptr(new identity());
            }
            return plural_ptr();
        }